

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningPlugin.cpp
# Opt level: O2

void * threadsafe_mem_leak_operator_new(size_t size)

{
  MemoryLeakDetector *this;
  TestMemoryAllocator *allocator;
  char *pcVar1;
  undefined8 *puVar2;
  MemLeakScopedMutex lock;
  
  MemLeakScopedMutex::MemLeakScopedMutex(&lock);
  this = MemoryLeakWarningPlugin::getGlobalDetector();
  allocator = getCurrentNewAllocator();
  pcVar1 = MemoryLeakDetector::allocMemory(this,allocator,size,false);
  if (pcVar1 != (char *)0x0) {
    ScopedMutexLock::~ScopedMutexLock(&lock.lock);
    return pcVar1;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = fclose;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

UT_THROW(std::bad_alloc)
{
    MemLeakScopedMutex lock;
    void* memory = MemoryLeakWarningPlugin::getGlobalDetector()->allocMemory(getCurrentNewAllocator(), size);
    UT_THROW_BAD_ALLOC_WHEN_NULL(memory);
    return memory;
}